

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datalogDatabase.cpp
# Opt level: O0

void __thiscall DatalogDatabase::dump_rules(DatalogDatabase *this,ostream *out)

{
  ulong uVar1;
  size_t sVar2;
  size_type sVar3;
  ostream *this_00;
  void *this_01;
  Rule local_40;
  ulong local_20;
  size_t k;
  ostream *out_local;
  DatalogDatabase *this_local;
  
  local_20 = 0;
  k = (size_t)out;
  out_local = (ostream *)this;
  while( true ) {
    uVar1 = local_20;
    sVar3 = std::vector<Rule_*,_std::allocator<Rule_*>_>::size(&this->rules);
    sVar2 = k;
    if (sVar3 <= uVar1) break;
    std::vector<Rule_*,_std::allocator<Rule_*>_>::operator[](&this->rules,local_20);
    Rule::toString_abi_cxx11_(&local_40);
    this_00 = std::operator<<((ostream *)sVar2,(string *)&local_40);
    this_01 = (void *)std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)&local_40);
    local_20 = local_20 + 1;
  }
  return;
}

Assistant:

void DatalogDatabase::dump_rules(ostream& out)
{
  for (size_t k = 0; k < rules.size(); k++)
  {
    out << rules[k]->toString() << endl << endl;
  }
}